

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ssize_t sVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  undefined7 uVar6;
  void *__buf_00;
  undefined4 in_register_00000034;
  char local_230 [8];
  fstream input;
  string *filename_local;
  MidiFile *this_local;
  
  uVar5 = (undefined1)__nbytes;
  uVar6 = (undefined7)(__nbytes >> 8);
  this->m_timemapvalid = false;
  setFilename(this,(string *)CONCAT44(in_register_00000034,__fd));
  this->m_rwstatus = true;
  std::fstream::fstream(local_230);
  _Var2 = std::__cxx11::string::c_str();
  std::operator|(_S_bin,_S_in);
  std::fstream::open(local_230,_Var2);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    this->m_rwstatus = false;
    uVar5 = this->m_rwstatus;
  }
  else {
    sVar3 = read(this,(int)local_230,__buf_00,CONCAT71(uVar6,uVar5));
    this->m_rwstatus = (bool)((byte)sVar3 & 1);
    uVar5 = this->m_rwstatus;
  }
  uVar4 = std::fstream::~fstream(local_230);
  return CONCAT71((int7)((ulong)uVar4 >> 8),uVar5) & 0xffffffffffffff01;
}

Assistant:

bool MidiFile::read(const std::string& filename) {
	m_timemapvalid = 0;
	setFilename(filename);
	m_rwstatus = true;

	std::fstream input;
	input.open(filename.c_str(), std::ios::binary | std::ios::in);

	if (!input.is_open()) {
		m_rwstatus = false;
		return m_rwstatus;
	}

	m_rwstatus = read(input);
	return m_rwstatus;
}